

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

int has_reserved(char type)

{
  int iVar1;
  char type_local;
  int local_4;
  
  iVar1 = (int)type;
  if (((iVar1 == 0x46) || (iVar1 == 0x49)) || (iVar1 == 0x4e)) {
LAB_0010444b:
    local_4 = 0;
  }
  else {
    if (iVar1 != 0x53) {
      if (((iVar1 == 0x54) || (iVar1 == 0x5b)) || (iVar1 == 0x5d)) goto LAB_0010444b;
      if (((2 < iVar1 - 0x62U) && (iVar1 != 0x66)) &&
         ((1 < iVar1 - 0x68U && ((iVar1 != 0x6d && (2 < iVar1 - 0x72U)))))) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int has_reserved(char type)
{
    switch(type)
    {
        case 'i'://official types
        case 's':
        case 'b':
        case 'f':

        case 'h'://unofficial
        case 't':
        case 'd':
        case 'S':
        case 'r':
        case 'm':
        case 'c':
            return 1;
        case 'T':
        case 'F':
        case 'N':
        case 'I':
        case '[':
        case ']':
            return 0;
    }

    //Should not happen
    return 0;
}